

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

InsertionResult * __thiscall
QHashPrivate::Data<QHashPrivate::Node<ProKey,_QHashDummyValue>_>::findOrInsert<ProKey>
          (InsertionResult *__return_storage_ptr__,
          Data<QHashPrivate::Node<ProKey,_QHashDummyValue>_> *this,ProKey *key)

{
  Span *pSVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  Bucket BVar5;
  
  uVar4 = this->seed;
  sVar3 = qHash(&key->super_ProString);
  uVar4 = sVar3 ^ uVar4;
  if (this->numBuckets == 0) {
    BVar5 = (Bucket)ZEXT816(0);
  }
  else {
    BVar5 = findBucketWithHash<ProKey>(this,key,uVar4);
    bVar2 = true;
    if ((BVar5.span)->offsets[BVar5.index] != 0xff) goto LAB_00271749;
  }
  if (this->numBuckets >> 1 <= this->size) {
    rehash(this,this->size + 1);
    BVar5 = findBucketWithHash<ProKey>(this,key,uVar4);
  }
  Span<QHashPrivate::Node<ProKey,_QHashDummyValue>_>::insert(BVar5.span,BVar5.index);
  this->size = this->size + 1;
  bVar2 = false;
LAB_00271749:
  pSVar1 = this->spans;
  (__return_storage_ptr__->it).d = this;
  (__return_storage_ptr__->it).bucket =
       ((ulong)((long)BVar5.span - (long)pSVar1) >> 4) * 0x1c71c71c71c71c80 | BVar5.index;
  __return_storage_ptr__->initialized = bVar2;
  return __return_storage_ptr__;
}

Assistant:

InsertionResult findOrInsert(const K &key) noexcept
    {
        Bucket it(static_cast<Span *>(nullptr), 0);
        size_t hash = QHashPrivate::calculateHash(key, seed);
        if (numBuckets > 0) {
            it = findBucketWithHash(key, hash);
            if (!it.isUnused())
                return { it.toIterator(this), true };
        }
        if (shouldGrow()) {
            rehash(size + 1);
            it = findBucketWithHash(key, hash); // need to get a new iterator after rehashing
        }
        Q_ASSERT(it.span != nullptr);
        Q_ASSERT(it.isUnused());
        it.insert();
        ++size;
        return { it.toIterator(this), false };
    }